

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

int __thiscall FIX::IntField::getValue(IntField *this)

{
  int iVar1;
  
  iVar1 = IntTConvertor<int>::convert(&(this->super_FieldBase).m_string);
  return iVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return IntConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }